

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_hmc_multiple_val.cpp
# Opt level: O0

double calc_action(double *x,double (*A) [3])

{
  int local_28;
  int local_24;
  int jdim;
  int idim;
  double action;
  double (*A_local) [3];
  double *x_local;
  
  _jdim = 0.0;
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
      _jdim = x[local_24] * A[local_24][local_28] * x[local_28] + _jdim;
    }
    _jdim = x[local_24] * 0.5 * A[local_24][local_24] * x[local_24] + _jdim;
  }
  return _jdim;
}

Assistant:

double calc_action(const double x[ndim], const double A[ndim][ndim]) {
    double action = 0e0;
    for (int idim = 0; idim < ndim; idim++) {
        for (int jdim = 0; jdim < idim; jdim++) {
            action += x[idim] * A[idim][jdim] * x[jdim];
        }
        action += 0.5e0 * x[idim] * A[idim][idim] * x[idim];
    }
    return action;
}